

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiLabelFileParser.cpp
# Opt level: O1

void __thiscall
MultiLabelFileParser::writeLabelList(MultiLabelFileParser *this,string *labelListFilename)

{
  long lVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ofstream labelListFp;
  char local_231;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)labelListFilename);
  if (this->_L != 0) {
    uVar3 = 0;
    do {
      if ((this->_C).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] != 0) {
        lVar4 = 8;
        uVar5 = 0;
        do {
          lVar1 = *(long *)&(this->_labelList).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar3].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,*(char **)(lVar1 + -8 + lVar4),*(long *)(lVar1 + lVar4));
          if (uVar5 != (this->_C).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar3] - 1) {
            local_231 = ',';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x20;
        } while (uVar5 < (this->_C).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar3]);
      }
      if (uVar3 != this->_L - 1) {
        cVar2 = (char)(string *)&local_230;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->_L);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MultiLabelFileParser::writeLabelList(string labelListFilename)const{//{{{
    ofstream labelListFp;
    labelListFp.open(labelListFilename,ios::out);
    for(int l=0; l<_L; l++){
        for(int c=0; c<_C[l]; c++){
            labelListFp<<_labelList[l][c];
            if(c != (_C[l]-1))labelListFp<<',';
        }
        if(l != (_L-1))labelListFp<<endl;
    }
    labelListFp.close();
}